

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8e_api_v2.c
# Opt level: O1

MPP_RET vp8e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  RK_U32 change;
  undefined4 *puVar5;
  undefined8 uVar6;
  
  lVar4 = *ctx;
  if (((byte)vp8e_debug & 1) != 0) {
    _mpp_log_l(4,"vp8e_api_v2","enter ctx %p cmd %x param %p\n","vp8e_proc_cfg",ctx,cmd,param);
  }
  if (cmd != MPP_ENC_SET_CFG) {
    _mpp_log_l(2,"vp8e_api_v2","No correspond cmd found, and can not config!",(char *)0x0);
    uVar6 = 0xffffffff;
    goto LAB_001d44cc;
  }
  uVar1 = *(uint *)((long)param + 0x10);
  uVar6 = 0;
  if (uVar1 != 0) {
    if ((uVar1 & 4) != 0) {
      uVar6 = 0;
      if (0x1000f < *(uint *)((long)param + 0x2c) || *(uint *)((long)param + 0x2c) - 0x14 < 0xffec)
      {
        _mpp_log_l(2,"vp8e_api_v2","invalid format %d\n",(char *)0x0);
        uVar6 = 0xffffffff;
      }
      *(undefined4 *)(lVar4 + 0x24) = *(undefined4 *)((long)param + 0x2c);
    }
    if ((uVar1 & 0x10) != 0) {
      *(undefined4 *)(lVar4 + 0x54) = *(undefined4 *)((long)param + 0x5c);
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined4 *)(lVar4 + 0x5c) = *(undefined4 *)((long)param + 100);
    }
    if ((uVar1 & 0x40) != 0) {
      *(undefined4 *)(lVar4 + 0x60) = *(undefined4 *)((long)param + 0x68);
    }
    if (((3 < *(uint *)(lVar4 + 0x54)) || (*(int *)(lVar4 + 0x5c) < 0)) ||
       (*(int *)(lVar4 + 0x60) < 0)) {
      _mpp_log_l(2,"vp8e_api_v2","invalid trans: rotation %d, mirroring %d\n",(char *)0x0,
                 (ulong)*(uint *)(lVar4 + 0x54),(ulong)*(uint *)(lVar4 + 0x5c));
      uVar6 = 0xfffffffa;
    }
    uVar3 = *(uint *)(lVar4 + 0x54) & 3 ^ 2;
    uVar2 = (uint)(*(uint *)(lVar4 + 0x5c) == 0);
    if (*(int *)(lVar4 + 0x60) == 0) {
      uVar3 = *(uint *)(lVar4 + 0x54);
      uVar2 = *(uint *)(lVar4 + 0x5c);
    }
    *(uint *)(lVar4 + 0x58) = uVar2;
    *(uint *)(lVar4 + 0x50) = uVar3;
    if ((uVar1 & 0x11) != 0) {
      if (((0x780 < *(uint *)((long)param + 0x14)) || (0xf00 < *(uint *)((long)param + 0x18))) ||
         ((0x1e00 < *(uint *)((long)param + 0x1c) || (0xf00 < *(uint *)((long)param + 0x20))))) {
        _mpp_log_l(2,"vp8e_api_v2","invalid input w:h [%d:%d] [%d:%d]\n",(char *)0x0,
                   (ulong)*(uint *)((long)param + 0x14),(ulong)*(uint *)((long)param + 0x18),
                   (ulong)*(uint *)((long)param + 0x1c),(ulong)*(uint *)((long)param + 0x20));
        uVar6 = 0xffffffff;
      }
      if ((*(uint *)(lVar4 + 0x50) | 2) == 3) {
        puVar5 = (undefined4 *)((long)param + 0x14);
        *(undefined4 *)(lVar4 + 0xc) = *(undefined4 *)((long)param + 0x18);
      }
      else {
        *(undefined4 *)(lVar4 + 0xc) = *(undefined4 *)((long)param + 0x14);
        puVar5 = (undefined4 *)((long)param + 0x18);
      }
      *(undefined4 *)(lVar4 + 0x10) = *puVar5;
      *(undefined4 *)(lVar4 + 0x18) = *(undefined4 *)((long)param + 0x20);
      *(undefined4 *)(lVar4 + 0x14) = *(undefined4 *)((long)param + 0x1c);
    }
    *(uint *)(lVar4 + 8) = *(uint *)(lVar4 + 8) | *(uint *)((long)param + 0x10);
    if ((*(uint *)(lVar4 + 0x50) | 2) == 3) {
      uVar2 = *(uint *)(lVar4 + 0x10);
      uVar1 = *(uint *)(lVar4 + 0x14);
      if (((int)uVar1 < (int)uVar2) || (*(int *)(lVar4 + 0x18) < *(int *)(lVar4 + 0xc))) {
        uVar3 = *(uint *)(lVar4 + 0xc);
LAB_001d432d:
        _mpp_log_l(2,"vp8e_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                   (ulong)uVar3,(ulong)uVar2,(ulong)uVar1,(ulong)*(uint *)(lVar4 + 0x18));
        uVar6 = 0xfffffffa;
      }
    }
    else {
      uVar3 = *(uint *)(lVar4 + 0xc);
      uVar1 = *(uint *)(lVar4 + 0x14);
      if (((int)uVar1 < (int)uVar3) || (*(int *)(lVar4 + 0x18) < *(int *)(lVar4 + 0x10))) {
        uVar2 = *(uint *)(lVar4 + 0x10);
        goto LAB_001d432d;
      }
    }
    if (((byte)vp8e_debug & 2) != 0) {
      _mpp_log_l(4,"vp8e_api_v2","width %d height %d hor_stride %d ver_srtride %d format 0x%x\n",
                 "vp8e_proc_prep_cfg",(ulong)*(uint *)(lVar4 + 0xc),(ulong)*(uint *)(lVar4 + 0x10),
                 (ulong)*(uint *)(lVar4 + 0x14),(ulong)*(uint *)(lVar4 + 0x18),
                 (ulong)*(uint *)(lVar4 + 0x24));
    }
    *(undefined4 *)((long)param + 0x10) = 0;
  }
  uVar1 = *(uint *)((long)param + 0x350);
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)(lVar4 + 0x350) = *(undefined4 *)((long)param + 0x358);
      *(undefined4 *)(lVar4 + 0x354) = *(undefined4 *)((long)param + 0x35c);
      *(undefined4 *)(lVar4 + 0x35c) = *(undefined4 *)((long)param + 0x364);
      *(undefined4 *)(lVar4 + 0x358) = *(undefined4 *)((long)param + 0x360);
      *(undefined4 *)(lVar4 + 0x360) = *(undefined4 *)((long)param + 0x368);
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)(lVar4 + 0x368) = *(undefined4 *)((long)param + 0x370);
    }
    if (((byte)vp8e_debug & 2) != 0) {
      _mpp_log_l(4,"vp8e_api_v2",
                 "rc cfg qp_init %d qp_max %d qp_min %d qp_max_i %d qp_min_i %d, disable_ivf %d\n",
                 "vp8e_proc_vp8_cfg",(ulong)*(uint *)(lVar4 + 0x350),(ulong)*(uint *)(lVar4 + 0x354)
                 ,(ulong)*(uint *)(lVar4 + 0x35c),(ulong)*(uint *)(lVar4 + 0x358),
                 (ulong)*(uint *)(lVar4 + 0x360),(ulong)*(uint *)(lVar4 + 0x368));
    }
    *(uint *)(lVar4 + 0x348) = *(uint *)(lVar4 + 0x348) | *(uint *)((long)param + 0x350);
    *(undefined4 *)((long)param + 0x350) = 0;
  }
  uVar1 = *(uint *)((long)param + 0xe98);
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)(lVar4 + 0xe94) = *(undefined4 *)((long)param + 0xe9c);
      *(undefined4 *)(lVar4 + 0xe98) = *(undefined4 *)((long)param + 0xea0);
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)(lVar4 + 0xe98) = *(undefined4 *)((long)param + 0xea0);
    }
    *(uint *)(lVar4 + 0xe90) = *(uint *)(lVar4 + 0xe90) | uVar1;
    *(undefined4 *)((long)param + 0xe98) = 0;
  }
LAB_001d44cc:
  if (((byte)vp8e_debug & 1) != 0) {
    _mpp_log_l(4,"vp8e_api_v2","leave ret %d\n","vp8e_proc_cfg",uVar6);
  }
  return (MPP_RET)uVar6;
}

Assistant:

static MPP_RET vp8e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    Vp8eCtx *p = (Vp8eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;
    MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
    MppEncCfgSet *src = &impl->cfg;

    vp8e_dbg_fun("enter ctx %p cmd %x param %p\n", ctx, cmd, param);
    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        if (src->prep.change) {
            ret |= vp8e_proc_prep_cfg(&cfg->prep, &src->prep);
            src->prep.change = 0;
        }
        if (src->codec.vp8.change) {
            ret |= vp8e_proc_vp8_cfg(&cfg->codec.vp8, &src->codec.vp8);
            src->codec.vp8.change = 0;
        }
        if (src->split.change) {
            ret |= vp8e_proc_split_cfg(&cfg->split, &src->split);
            src->split.change = 0;
        }
    } break;
    default: {
        mpp_err("No correspond cmd found, and can not config!");
        ret = MPP_NOK;
    } break;
    }

    vp8e_dbg_fun("leave ret %d\n", ret);
    return ret;
}